

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O2

void __thiscall gv_visitor::visit(gv_visitor *this,DeclarationsWithMethod *ptr)

{
  Declarations *second;
  MethodDeclaration *second_00;
  string local_48;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"decl with method",&local_21);
  box(this,ptr,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  second = ptr->prev_decls;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"decls",&local_21);
  arrow(this,ptr,second,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (**(ptr->prev_decls->super_Base)._vptr_Base)(ptr->prev_decls,this);
  second_00 = ptr->method_decl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"method decl",&local_21);
  arrow(this,ptr,second_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (**(ptr->method_decl->super_Declaration).super_Base._vptr_Base)(ptr->method_decl,this);
  return;
}

Assistant:

void gv_visitor::visit(DeclarationsWithMethod* ptr) {
    box(ptr, "decl with method");
    arrow(ptr, ptr->prev_decls, "decls");
    ptr->prev_decls->accept(this);
    arrow(ptr, ptr->method_decl, "method decl");
    ptr->method_decl->accept(this);
}